

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O2

void pbrt::VolPathIntegrator::rescale
               (SampledSpectrum *beta,SampledSpectrum *pdfLight,SampledSpectrum *pdfUni)

{
  Float FVar1;
  undefined4 local_1c;
  
  FVar1 = SampledSpectrum::MaxComponentValue(beta);
  local_1c = 5.9604645e-08;
  if (FVar1 <= 16777216.0) {
    FVar1 = SampledSpectrum::MaxComponentValue(pdfLight);
    if (FVar1 <= 16777216.0) {
      FVar1 = SampledSpectrum::MaxComponentValue(pdfUni);
      if (FVar1 <= 16777216.0) {
        FVar1 = SampledSpectrum::MaxComponentValue(beta);
        local_1c = 16777216.0;
        if (5.9604645e-08 <= FVar1) {
          FVar1 = SampledSpectrum::MaxComponentValue(pdfLight);
          if (5.9604645e-08 <= FVar1) {
            FVar1 = SampledSpectrum::MaxComponentValue(pdfUni);
            if (5.9604645e-08 <= FVar1) {
              return;
            }
          }
        }
      }
    }
  }
  SampledSpectrum::operator*=(beta,local_1c);
  SampledSpectrum::operator*=(pdfLight,local_1c);
  SampledSpectrum::operator*=(pdfUni,local_1c);
  return;
}

Assistant:

static void rescale(SampledSpectrum &beta, SampledSpectrum &pdfLight,
                        SampledSpectrum &pdfUni) {
        if (beta.MaxComponentValue() > 0x1p24f ||
            pdfLight.MaxComponentValue() > 0x1p24f ||
            pdfUni.MaxComponentValue() > 0x1p24f) {
            beta *= 1.f / 0x1p24f;
            pdfLight *= 1.f / 0x1p24f;
            pdfUni *= 1.f / 0x1p24f;
        } else if (beta.MaxComponentValue() < 0x1p-24f ||
                   pdfLight.MaxComponentValue() < 0x1p-24f ||
                   pdfUni.MaxComponentValue() < 0x1p-24f) {
            beta *= 0x1p24f;
            pdfLight *= 0x1p24f;
            pdfUni *= 0x1p24f;
        }
    }